

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_collapse_rail.cpp
# Opt level: O2

void Omega_h::choose_rails
               (Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_edge_codes,
               Reals *cand_edge_quals,Read<signed_char> *verts_are_cands,Reals *vert_quals,
               Read<long> *vert_rails)

{
  element_type *peVar1;
  element_type *peVar2;
  char cVar3;
  int iVar4;
  Omega_h_Parting OVar5;
  LO LVar6;
  uint uVar7;
  long lVar8;
  element_type *peVar9;
  uint uVar10;
  ulong uVar11;
  Int ent_dim;
  char *pcVar12;
  bool bVar13;
  long lVar14;
  element_type *peVar15;
  element_type *peVar16;
  undefined8 uStack_3b0;
  LOs edges2cands;
  undefined1 local_388 [56];
  pointer local_350;
  Write<signed_char> local_348;
  Write<int> local_338;
  Write<signed_char> local_328;
  Write<signed_char> local_318;
  Write<signed_char> local_308;
  Write<signed_char> local_2f8;
  Write<int> local_2e8;
  Write<long> vert_rails_w;
  Write<double> vert_quals_w;
  Write<signed_char> verts_are_cands_w;
  Write<int> local_290;
  Write<int> local_280;
  Write<double> local_270;
  Write<double> local_260;
  Write<signed_char> local_250;
  Write<signed_char> local_240;
  Read<long> globals;
  Reals lengths;
  Read<signed_char> ve_codes;
  LOs ve2e;
  LOs v2ve;
  LOs ev2v;
  Write<int> local_1d0;
  Write<int> local_1c0;
  Write<int> local_1b0;
  Write<int> local_1a0;
  Write<signed_char> local_190;
  Write<signed_char> local_180;
  Write<int> local_170;
  Write<double> local_160;
  Write<double> local_150;
  Write<signed_char> local_140;
  Write<double> local_130;
  Write<int> local_120;
  type f;
  Adj v2e;
  
  OVar5 = Mesh::parting(mesh);
  if (OVar5 != OMEGA_H_GHOSTED) {
    fail("assertion %s failed at %s +%d\n","mesh->parting() == OMEGA_H_GHOSTED",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_collapse_rail.cpp"
         ,0x12);
  }
  Write<int>::Write(&local_1d0,&cands2edges->write_);
  LVar6 = Mesh::nedges(mesh);
  invert_injective_map((Omega_h *)&edges2cands,(LOs *)&local_1d0,LVar6);
  Write<int>::~Write(&local_1d0);
  Mesh::ask_up(&v2e,mesh,0,1);
  Write<int>::Write(&v2ve.write_,(Write<int> *)&v2e);
  Write<int>::Write(&ve2e.write_,&v2e.super_Graph.ab2b.write_);
  Write<signed_char>::Write(&ve_codes.write_,&v2e.codes.write_);
  ent_dim = (Int)mesh;
  Mesh::ask_verts_of((Mesh *)&ev2v,ent_dim);
  Mesh::ask_lengths((Mesh *)&lengths);
  Mesh::globals((Mesh *)&globals,ent_dim);
  LVar6 = Mesh::nverts(mesh);
  std::__cxx11::string::string((string *)local_388,"",(allocator *)&local_1c0);
  Write<signed_char>::Write(&verts_are_cands_w,LVar6,(string *)local_388);
  std::__cxx11::string::~string((string *)local_388);
  LVar6 = Mesh::nverts(mesh);
  std::__cxx11::string::string((string *)local_388,"",(allocator *)&local_1c0);
  Write<double>::Write(&vert_quals_w,LVar6,(string *)local_388);
  std::__cxx11::string::~string((string *)local_388);
  LVar6 = Mesh::nverts(mesh);
  std::__cxx11::string::string((string *)local_388,"",(allocator *)&local_1c0);
  Write<long>::Write(&vert_rails_w,LVar6,(string *)local_388);
  std::__cxx11::string::~string((string *)local_388);
  Write<int>::Write((Write<int> *)&f,&v2ve.write_);
  Write<int>::Write(&f.ve2e.write_,&ve2e.write_);
  Write<int>::Write(&f.edges2cands.write_,&edges2cands.write_);
  Write<signed_char>::Write(&f.ve_codes.write_,&ve_codes.write_);
  Write<signed_char>::Write(&f.cand_edge_codes.write_,&cand_edge_codes->write_);
  Write<long>::Write((Write<int> *)&f.globals,(Write<int> *)&globals);
  Write<double>::Write(&f.lengths.write_,&lengths.write_);
  Write<double>::Write(&f.cand_edge_quals.write_,&cand_edge_quals->write_);
  Write<signed_char>::Write(&f.verts_are_cands_w,&verts_are_cands_w);
  Write<double>::Write(&f.vert_quals_w,&vert_quals_w);
  Write<long>::Write((Write<int> *)&f.vert_rails_w,(Write<int> *)&vert_rails_w);
  uVar7 = Mesh::nverts(mesh);
  Write<int>::Write(&local_1c0,(Write<int> *)&f);
  Write<int>::Write(&local_1b0,&f.ve2e.write_);
  Write<int>::Write(&local_1a0,&f.edges2cands.write_);
  Write<signed_char>::Write(&local_190,&f.ve_codes.write_);
  Write<signed_char>::Write(&local_180,&f.cand_edge_codes.write_);
  Write<long>::Write(&local_170,(Write<int> *)&f.globals);
  Write<double>::Write(&local_160,&f.lengths.write_);
  Write<double>::Write(&local_150,&f.cand_edge_quals.write_);
  Write<signed_char>::Write(&local_140,&f.verts_are_cands_w);
  Write<double>::Write(&local_130,&f.vert_quals_w);
  Write<long>::Write(&local_120,(Write<int> *)&f.vert_rails_w);
  if (0 < (int)uVar7) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)local_388,&local_1c0);
    Write<int>::Write((Write<int> *)(local_388 + 0x10),&local_1b0);
    Write<int>::Write((Write<int> *)(local_388 + 0x20),&local_1a0);
    Write<signed_char>::Write((Write<signed_char> *)(local_388 + 0x30),&local_190);
    Write<signed_char>::Write(&local_348,&local_180);
    Write<long>::Write(&local_338,&local_170);
    Write<double>::Write(&local_328,(Write<signed_char> *)&local_160);
    Write<double>::Write(&local_318,(Write<signed_char> *)&local_150);
    Write<signed_char>::Write(&local_308,&local_140);
    Write<double>::Write(&local_2f8,(Write<signed_char> *)&local_130);
    Write<long>::Write(&local_2e8,&local_120);
    entering_parallel = 0;
    for (uVar11 = 0; uVar11 != uVar7; uVar11 = uVar11 + 1) {
      bVar13 = false;
      peVar15 = (element_type *)0xbff0000000000000;
      peVar16 = (element_type *)0xbff0000000000000;
      peVar9 = (element_type *)0xffffffffffffffff;
      for (lVar14 = (long)*(int *)((long)(Library **)local_388._8_8_ + uVar11 * 4);
          lVar14 < *(int *)((long)(Library **)local_388._8_8_ + uVar11 * 4 + 4); lVar14 = lVar14 + 1
          ) {
        lVar8 = (long)*(int *)(local_388._24_8_ + lVar14 * 4);
        iVar4 = *(int *)(local_388._40_8_ + lVar8 * 4);
        if ((long)iVar4 != -1) {
          cVar3 = *(char *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                     *)local_348.shared_alloc_.direct_ptr)->_M_ptr + (long)iVar4);
          if (cVar3 == '\0') {
            pcVar12 = "cand_code != DONT_COLLAPSE";
            uStack_3b0 = 0x2a;
            goto LAB_0025c42c;
          }
          uVar10 = (uint)(*(char *)((long)&(local_350->
                                           super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr + lVar14) >> 3);
          if (((uint)(int)cVar3 >> (uVar10 & 0x1f) & 1) != 0) {
            peVar1 = (&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                       local_328.shared_alloc_.direct_ptr)->_M_ptr)[lVar8];
            peVar2 = (&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                       local_318.shared_alloc_.direct_ptr)->_M_ptr)[(int)(uVar10 + iVar4 * 2)];
            if (((peVar9 == (element_type *)0xffffffffffffffff) ||
                ((double)peVar1 < (double)peVar16)) ||
               (((double)peVar1 == (double)peVar16 &&
                ((!NAN((double)peVar1) && !NAN((double)peVar16) &&
                 ((double)peVar15 < (double)peVar2)))))) {
              bVar13 = true;
              peVar9 = (&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                         local_338.shared_alloc_.direct_ptr)->_M_ptr)[lVar8];
              peVar15 = peVar2;
              peVar16 = peVar1;
            }
          }
        }
      }
      *(bool *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                       local_308.shared_alloc_.direct_ptr)->_M_ptr + uVar11) = bVar13;
      if ((bVar13) && (peVar9 == (element_type *)0xffffffffffffffff)) {
        uStack_3b0 = 0x38;
        pcVar12 = "best_global != -1";
LAB_0025c42c:
        fail("assertion %s failed at %s +%d\n",pcVar12,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_collapse_rail.cpp"
             ,uStack_3b0);
      }
      ((_func_int ***)local_2f8.shared_alloc_.direct_ptr)[uVar11] = (_func_int **)peVar15;
      ((_func_int ***)local_2e8.shared_alloc_.direct_ptr)[uVar11] = (_func_int **)peVar9;
    }
    choose_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<signed_char>*,Omega_h::Read<double>*,Omega_h::Read<long>*)
    ::$_0::~__0((__0 *)local_388);
  }
  choose_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<signed_char>*,Omega_h::Read<double>*,Omega_h::Read<long>*)
  ::$_0::~__0((__0 *)&local_1c0);
  Write<signed_char>::Write(&local_240,&verts_are_cands_w);
  Read<signed_char>::Read((Read<signed_char> *)local_388,&local_240);
  Write<signed_char>::operator=(&verts_are_cands->write_,(Write<signed_char> *)local_388);
  Write<signed_char>::~Write((Write<signed_char> *)local_388);
  Write<signed_char>::~Write(&local_240);
  Write<signed_char>::Write(&local_250,&verts_are_cands->write_);
  Mesh::sync_array<signed_char>((Mesh *)local_388,ent_dim,(Read<signed_char> *)0x0,(Int)&local_250);
  Write<signed_char>::operator=(&verts_are_cands->write_,(Write<signed_char> *)local_388);
  Write<signed_char>::~Write((Write<signed_char> *)local_388);
  Write<signed_char>::~Write(&local_250);
  Write<double>::Write(&local_260,&vert_quals_w);
  Read<double>::Read((Read<signed_char> *)local_388,&local_260);
  Write<double>::operator=(&vert_quals->write_,(Write<signed_char> *)local_388);
  Write<double>::~Write((Write<double> *)local_388);
  Write<double>::~Write(&local_260);
  Write<double>::Write(&local_270,&vert_quals->write_);
  Mesh::sync_array<double>((Mesh *)local_388,ent_dim,(Read<double> *)0x0,(Int)&local_270);
  Write<double>::operator=(&vert_quals->write_,(Write<signed_char> *)local_388);
  Write<double>::~Write((Write<double> *)local_388);
  Write<double>::~Write(&local_270);
  Write<long>::Write(&local_280,(Write<int> *)&vert_rails_w);
  Read<long>::Read((Read<signed_char> *)local_388,(Write<long> *)&local_280);
  Write<long>::operator=(&vert_rails->write_,(Write<long> *)local_388);
  Write<long>::~Write((Write<long> *)local_388);
  Write<long>::~Write((Write<long> *)&local_280);
  Write<long>::Write(&local_290,(Write<int> *)vert_rails);
  Mesh::sync_array<long>((Mesh *)local_388,ent_dim,(Read<long> *)0x0,(Int)&local_290);
  Write<long>::operator=(&vert_rails->write_,(Write<long> *)local_388);
  Write<long>::~Write((Write<long> *)local_388);
  Write<long>::~Write((Write<long> *)&local_290);
  choose_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<signed_char>*,Omega_h::Read<double>*,Omega_h::Read<long>*)
  ::$_0::~__0((__0 *)&f);
  Write<long>::~Write(&vert_rails_w);
  Write<double>::~Write(&vert_quals_w);
  Write<signed_char>::~Write(&verts_are_cands_w);
  Write<long>::~Write(&globals.write_);
  Write<double>::~Write(&lengths.write_);
  Write<int>::~Write(&ev2v.write_);
  Write<signed_char>::~Write(&ve_codes.write_);
  Write<int>::~Write(&ve2e.write_);
  Write<int>::~Write(&v2ve.write_);
  Adj::~Adj(&v2e);
  Write<int>::~Write(&edges2cands.write_);
  return;
}

Assistant:

void choose_rails(Mesh* mesh, LOs cands2edges, Read<I8> cand_edge_codes,
    Reals cand_edge_quals, Read<I8>* verts_are_cands, Reals* vert_quals,
    Read<GO>* vert_rails) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  auto edges2cands = invert_injective_map(cands2edges, mesh->nedges());
  auto v2e = mesh->ask_up(VERT, EDGE);
  auto v2ve = v2e.a2ab;
  auto ve2e = v2e.ab2b;
  auto ve_codes = v2e.codes;
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto lengths = mesh->ask_lengths();
  auto globals = mesh->globals(EDGE);
  auto verts_are_cands_w = Write<I8>(mesh->nverts());
  auto vert_quals_w = Write<Real>(mesh->nverts());
  auto vert_rails_w = Write<GO>(mesh->nverts());
  auto f = OMEGA_H_LAMBDA(LO v) {
    bool vert_is_cand = false;
    GO best_global = -1;
    Real best_length = -1;
    Real best_qual = -1;
    for (auto ve = v2ve[v]; ve < v2ve[v + 1]; ++ve) {
      auto e = ve2e[ve];
      auto cand = edges2cands[e];
      if (cand == -1) continue;
      auto ve_code = ve_codes[ve];
      auto eev = code_which_down(ve_code);
      auto cand_code = cand_edge_codes[cand];
      OMEGA_H_CHECK(cand_code != DONT_COLLAPSE);
      if (!collapses(cand_code, eev)) continue;
      auto global = globals[e];
      auto length = lengths[e];
      auto qual = cand_edge_quals[cand * 2 + eev];
      if ((best_global == -1) || (length < best_length) ||
          ((length == best_length) && (qual > best_qual))) {
        vert_is_cand = true;
        best_global = global;
        best_length = length;
        best_qual = qual;
      }
    }
    verts_are_cands_w[v] = vert_is_cand;
    if (vert_is_cand) OMEGA_H_CHECK(best_global != -1);
    vert_quals_w[v] = best_qual;
    vert_rails_w[v] = best_global;
  };
  parallel_for(mesh->nverts(), f, "choose_rails");
  *verts_are_cands = verts_are_cands_w;
  *verts_are_cands = mesh->sync_array(VERT, *verts_are_cands, 1);
  *vert_quals = vert_quals_w;
  *vert_quals = mesh->sync_array(VERT, *vert_quals, 1);
  *vert_rails = vert_rails_w;
  *vert_rails = mesh->sync_array(VERT, *vert_rails, 1);
}